

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gim_box_collision.h
# Opt level: O0

void __thiscall GIM_AABB::merge(GIM_AABB *this,GIM_AABB *box)

{
  float fVar1;
  btScalar *pbVar2;
  btVector3 *in_RSI;
  btVector3 *in_RDI;
  btScalar local_60;
  btScalar local_54;
  btScalar local_48;
  btScalar local_3c;
  btScalar local_30;
  btScalar local_24;
  
  pbVar2 = btVector3::operator_cast_to_float_(in_RDI);
  fVar1 = *pbVar2;
  pbVar2 = btVector3::operator_cast_to_float_(in_RSI);
  if (fVar1 < *pbVar2 || fVar1 == *pbVar2) {
    pbVar2 = btVector3::operator_cast_to_float_(in_RDI);
    local_24 = *pbVar2;
  }
  else {
    pbVar2 = btVector3::operator_cast_to_float_(in_RSI);
    local_24 = *pbVar2;
  }
  pbVar2 = btVector3::operator_cast_to_float_(in_RDI);
  *pbVar2 = local_24;
  pbVar2 = btVector3::operator_cast_to_float_(in_RDI);
  fVar1 = pbVar2[1];
  pbVar2 = btVector3::operator_cast_to_float_(in_RSI);
  if (fVar1 < pbVar2[1] || fVar1 == pbVar2[1]) {
    pbVar2 = btVector3::operator_cast_to_float_(in_RDI);
    local_30 = pbVar2[1];
  }
  else {
    pbVar2 = btVector3::operator_cast_to_float_(in_RSI);
    local_30 = pbVar2[1];
  }
  pbVar2 = btVector3::operator_cast_to_float_(in_RDI);
  pbVar2[1] = local_30;
  pbVar2 = btVector3::operator_cast_to_float_(in_RDI);
  fVar1 = pbVar2[2];
  pbVar2 = btVector3::operator_cast_to_float_(in_RSI);
  if (fVar1 < pbVar2[2] || fVar1 == pbVar2[2]) {
    pbVar2 = btVector3::operator_cast_to_float_(in_RDI);
    local_3c = pbVar2[2];
  }
  else {
    pbVar2 = btVector3::operator_cast_to_float_(in_RSI);
    local_3c = pbVar2[2];
  }
  pbVar2 = btVector3::operator_cast_to_float_(in_RDI);
  pbVar2[2] = local_3c;
  pbVar2 = btVector3::operator_cast_to_float_(in_RDI + 1);
  fVar1 = *pbVar2;
  pbVar2 = btVector3::operator_cast_to_float_(in_RSI + 1);
  if (*pbVar2 <= fVar1) {
    pbVar2 = btVector3::operator_cast_to_float_(in_RDI + 1);
    local_48 = *pbVar2;
  }
  else {
    pbVar2 = btVector3::operator_cast_to_float_(in_RSI + 1);
    local_48 = *pbVar2;
  }
  pbVar2 = btVector3::operator_cast_to_float_(in_RDI + 1);
  *pbVar2 = local_48;
  pbVar2 = btVector3::operator_cast_to_float_(in_RDI + 1);
  fVar1 = pbVar2[1];
  pbVar2 = btVector3::operator_cast_to_float_(in_RSI + 1);
  if (pbVar2[1] <= fVar1) {
    pbVar2 = btVector3::operator_cast_to_float_(in_RDI + 1);
    local_54 = pbVar2[1];
  }
  else {
    pbVar2 = btVector3::operator_cast_to_float_(in_RSI + 1);
    local_54 = pbVar2[1];
  }
  pbVar2 = btVector3::operator_cast_to_float_(in_RDI + 1);
  pbVar2[1] = local_54;
  pbVar2 = btVector3::operator_cast_to_float_(in_RDI + 1);
  fVar1 = pbVar2[2];
  pbVar2 = btVector3::operator_cast_to_float_(in_RSI + 1);
  if (pbVar2[2] <= fVar1) {
    pbVar2 = btVector3::operator_cast_to_float_(in_RDI + 1);
    local_60 = pbVar2[2];
  }
  else {
    pbVar2 = btVector3::operator_cast_to_float_(in_RSI + 1);
    local_60 = pbVar2[2];
  }
  pbVar2 = btVector3::operator_cast_to_float_(in_RDI + 1);
  pbVar2[2] = local_60;
  return;
}

Assistant:

SIMD_FORCE_INLINE void merge(const GIM_AABB & box)
	{
		m_min[0] = GIM_MIN(m_min[0],box.m_min[0]);
		m_min[1] = GIM_MIN(m_min[1],box.m_min[1]);
		m_min[2] = GIM_MIN(m_min[2],box.m_min[2]);

		m_max[0] = GIM_MAX(m_max[0],box.m_max[0]);
		m_max[1] = GIM_MAX(m_max[1],box.m_max[1]);
		m_max[2] = GIM_MAX(m_max[2],box.m_max[2]);
	}